

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shake256_impl.c
# Opt level: O2

int sprng256_next(keccak_sponge *sponge,uint8_t *entropy,size_t entropylen)

{
  int iVar1;
  
  if (entropy == (uint8_t *)0x0 || sponge == (keccak_sponge *)0x0) {
    iVar1 = -1;
  }
  else if ((long)entropylen < 0) {
    iVar1 = -2;
  }
  else {
    if (sponge->flags == 0xbf0420879da9f2d9) {
      _sponge_absorb(sponge,entropy,entropylen);
      memset(entropy,0,entropylen);
      iVar1 = sprng256_forget(sponge);
      return iVar1;
    }
    iVar1 = 2;
  }
  return iVar1;
}

Assistant:

int sprng256_next(keccak_sponge* const __restrict sponge,
                  uint8_t* const entropy,
                  const size_t entropylen) {
  if (sponge == NULL) {
    return SPONGERR_NULL;
  }
  if (entropy == NULL) {
    return SPONGERR_NULL;
  }
  if (entropylen > (SIZE_MAX >> 1)) {
    return SPONGERR_RSIZE;
  }
  if (sponge->flags != FLAG_SPONGEPRG) {
    return SPONGERR_NOTINIT;
  }

  _sponge_absorb(sponge, entropy, entropylen);  // Absorb the entropy,
  memset(entropy, 0, entropylen);               // zeroize the buffer,

  int err = sprng256_forget(sponge);  // And prevent baktracking.

  return err;
}